

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O1

void __thiscall winmd::reader::cache::remove_type(cache *this,string_view *ns,string_view *name)

{
  _Base_ptr p_Var1;
  TypeDef *__src;
  _Base_ptr p_Var2;
  TypeDef *pTVar3;
  iterator iVar4;
  __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  _Var5;
  
  iVar4 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
          ::find(&(this->m_namespaces)._M_t,ns);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->m_namespaces)._M_t._M_impl.super__Rb_tree_header)
  {
    _Var5 = std::operator()(*(undefined8 *)(iVar4._M_node + 3),iVar4._M_node[3]._M_parent,name);
    p_Var2 = iVar4._M_node[3]._M_parent;
    if ((_Base_ptr)_Var5._M_current != p_Var2) {
      p_Var1 = (_Base_ptr)(_Var5._M_current + 1);
      if (p_Var1 != p_Var2) {
        memmove(_Var5._M_current,p_Var1,(long)p_Var2 - (long)p_Var1);
      }
      iVar4._M_node[3]._M_parent = (_Base_ptr)&iVar4._M_node[3]._M_parent[-1]._M_left;
    }
    _Var5 = std::operator()(iVar4._M_node[3]._M_right,*(undefined8 *)(iVar4._M_node + 4),name);
    pTVar3 = *(TypeDef **)(iVar4._M_node + 4);
    if (_Var5._M_current != pTVar3) {
      __src = _Var5._M_current + 1;
      if (__src != pTVar3) {
        memmove(_Var5._M_current,__src,(long)pTVar3 - (long)__src);
      }
      *(long *)(iVar4._M_node + 4) = *(long *)(iVar4._M_node + 4) + -0x10;
    }
    _Var5 = std::operator()(iVar4._M_node[4]._M_left,iVar4._M_node[4]._M_right,name);
    p_Var2 = iVar4._M_node[4]._M_right;
    if ((_Base_ptr)_Var5._M_current != p_Var2) {
      p_Var1 = (_Base_ptr)(_Var5._M_current + 1);
      if (p_Var1 != p_Var2) {
        memmove(_Var5._M_current,p_Var1,(long)p_Var2 - (long)p_Var1);
      }
      iVar4._M_node[4]._M_right = (_Base_ptr)&iVar4._M_node[4]._M_right[-1]._M_left;
    }
    _Var5 = std::operator()(iVar4._M_node[5]._M_parent,iVar4._M_node[5]._M_left,name);
    p_Var2 = iVar4._M_node[5]._M_left;
    if ((_Base_ptr)_Var5._M_current != p_Var2) {
      p_Var1 = (_Base_ptr)(_Var5._M_current + 1);
      if (p_Var1 != p_Var2) {
        memmove(_Var5._M_current,p_Var1,(long)p_Var2 - (long)p_Var1);
      }
      iVar4._M_node[5]._M_left = (_Base_ptr)&iVar4._M_node[5]._M_left[-1]._M_left;
    }
    _Var5 = std::operator()(*(undefined8 *)(iVar4._M_node + 6),iVar4._M_node[6]._M_parent,name);
    p_Var2 = iVar4._M_node[6]._M_parent;
    if ((_Base_ptr)_Var5._M_current != p_Var2) {
      p_Var1 = (_Base_ptr)(_Var5._M_current + 1);
      if (p_Var1 != p_Var2) {
        memmove(_Var5._M_current,p_Var1,(long)p_Var2 - (long)p_Var1);
      }
      iVar4._M_node[6]._M_parent = (_Base_ptr)&iVar4._M_node[6]._M_parent[-1]._M_left;
    }
  }
  return;
}

Assistant:

void remove_type(std::string_view const& ns, std::string_view const& name)
        {
            auto m = m_namespaces.find(ns);
            if (m == m_namespaces.end())
            {
                return;
            }
            auto& members = m->second;

            auto remove = [&](auto&& collection, auto&& name)
            {
                auto pos = std::find_if(collection.begin(), collection.end(), [&](auto&& type)
                    {
                        return type.TypeName() == name;
                    });

                if (pos != collection.end())
                {
                    collection.erase(pos);
                }
            };

            remove(members.interfaces, name);
            remove(members.classes, name);
            remove(members.enums, name);
            remove(members.structs, name);
            remove(members.delegates, name);
        }